

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

void lws_cancel_service(lws_context *context)

{
  lws_log_cx *cx;
  int iVar1;
  lws **pplVar2;
  
  if ((context->field_0x7b7 & 8) == 0) {
    cx = lwsl_context_get_cx(context);
    _lws_log_cx(cx,lws_log_prepend_context,context,0x10,"lws_cancel_service","\n");
    pplVar2 = &context->pt[0].pipe_wsi;
    for (iVar1 = 0; iVar1 = (int)(short)iVar1, iVar1 < (int)(uint)context->count_threads;
        iVar1 = iVar1 + 1) {
      if (*pplVar2 != (lws *)0x0) {
        lws_plat_pipe_signal((lws_context *)pplVar2[-5],iVar1);
      }
      pplVar2 = pplVar2 + 0x34;
    }
  }
  return;
}

Assistant:

void
lws_cancel_service(struct lws_context *context)
{
	struct lws_context_per_thread *pt = &context->pt[0];
	short m;

	if (context->service_no_longer_possible)
		return;

	lwsl_cx_debug(context, "\n");

	for (m = 0; m < context->count_threads; m++) {
		if (pt->pipe_wsi)
			lws_plat_pipe_signal(pt->context, m);
		pt++;
	}
}